

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_pick(curl_hash *h,void *key,size_t key_len)

{
  curl_llist *pcVar1;
  curl_llist_element *pcVar2;
  size_t sVar3;
  curl_hash_element *he;
  curl_llist *l;
  curl_llist_element *le;
  size_t key_len_local;
  void *key_local;
  curl_hash *h_local;
  
  if (h != (curl_hash *)0x0) {
    pcVar1 = h->table;
    sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
    for (l = (curl_llist *)pcVar1[sVar3].head; l != (curl_llist *)0x0; l = (curl_llist *)l->dtor) {
      pcVar2 = l->head;
      sVar3 = (*h->comp_func)(&pcVar2[1].next,(size_t)pcVar2[1].prev,key,key_len);
      if (sVar3 != 0) {
        return pcVar2[1].ptr;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_llist *l;

  if(h) {
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}